

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_default(lys_module *module,void *node,char *value,yytokentype type)

{
  int local_28;
  int ret;
  yytokentype type_local;
  char *value_local;
  void *node_local;
  lys_module *module_local;
  
  if (type == LEAF_KEYWORD) {
    local_28 = yang_check_string(module,(char **)((long)node + 200),"default","leaf",value,
                                 (lys_node *)node);
  }
  else if (type == TYPEDEF_KEYWORD) {
    local_28 = yang_check_string(module,(char **)((long)node + 0x78),"default","typedef",value,
                                 (lys_node *)0x0);
  }
  else {
    free(value);
    ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_yang.c"
           ,0x1af);
    local_28 = 1;
  }
  return local_28;
}

Assistant:

int
yang_read_default(struct lys_module *module, void *node, char *value, enum yytokentype type)
{
    int ret;

    switch (type) {
    case LEAF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_node_leaf *) node)->dflt, "default", "leaf", value, node);
        break;
    case TYPEDEF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_tpdf *) node)->dflt, "default", "typedef", value, NULL);
        break;
    default:
        free(value);
        LOGINT(module->ctx);
        ret = EXIT_FAILURE;
        break;
    }
    return ret;
}